

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_update_camera3d(rf_camera3d *camera,rf_camera3d_state *state,
                       rf_input_state_for_update_camera input_state)

{
  rf_vec2 rVar1;
  rf_builtin_camera3d_mode rVar2;
  rf_vec2 rVar3;
  undefined1 auVar4 [16];
  rf_vec2 rVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  _Bool direction [6];
  char local_56 [6];
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_34;
  
  local_56[0] = input_state.direction_keys[0];
  local_56[1] = input_state.direction_keys[1];
  local_56[2] = input_state.direction_keys[2];
  local_56[3] = input_state.direction_keys[3];
  local_56[4] = input_state.direction_keys[4];
  local_56[5] = input_state.direction_keys[5];
  rVar2 = state->camera_mode;
  if (rVar2 == RF_CAMERA_CUSTOM) {
    return;
  }
  rVar1 = state->previous_mouse_position;
  state->previous_mouse_position = input_state.mouse_position;
  if (3 < rVar2 - RF_CAMERA_FREE) {
    return;
  }
  fVar18 = input_state.mouse_position.x - rVar1.x;
  fVar19 = input_state.mouse_position.y - rVar1.y;
  local_48._0_4_ = fVar18;
  local_48._4_4_ = fVar19;
  switch(rVar2) {
  case RF_CAMERA_FREE:
    fVar11 = state->camera_target_distance;
    if (-1 < input_state.mouse_wheel_move || 120.0 <= fVar11) {
      fVar12 = (camera->position).y;
      fVar10 = (camera->target).y;
      if (fVar12 <= fVar10 || (fVar11 != 120.0 || -1 < input_state.mouse_wheel_move)) {
        if ((fVar12 <= fVar10) || (fVar10 < 0.0)) {
          if ((fVar12 <= fVar10) || (input_state.mouse_wheel_move < 1 || 0.0 <= fVar10)) {
            if (fVar12 < fVar10) {
              if (fVar11 != 120.0 || -1 < input_state.mouse_wheel_move) {
                if (fVar10 <= 0.0) goto LAB_00124614;
                if (0 < input_state.mouse_wheel_move && 0.0 < fVar10) goto LAB_00124699;
              }
              else {
                fVar13 = (float)input_state.mouse_wheel_move;
                fVar11 = (camera->target).x;
                auVar16._0_4_ = fVar13 * (fVar11 - (camera->position).x) * 1.5;
                auVar16._4_4_ = fVar13 * (fVar10 - fVar12) * 1.5;
                auVar16._8_8_ = 0;
                auVar16 = divps(auVar16,_DAT_0016fcc0);
                (camera->target).x = auVar16._0_4_ + fVar11;
                (camera->target).y = auVar16._4_4_ + fVar10;
                fVar11 = (camera->target).z;
                (camera->target).z =
                     ((fVar11 - (camera->position).z) * fVar13 * 1.5) / 120.0 + fVar11;
                fVar11 = 120.0;
              }
            }
          }
          else {
LAB_00124699:
            fVar11 = fVar11 + (float)input_state.mouse_wheel_move * -1.5;
            state->camera_target_distance = fVar11;
            if (fVar11 < 0.3) {
              state->camera_target_distance = 0.3;
              fVar11 = 0.3;
            }
          }
        }
        else {
LAB_00124614:
          fVar14 = (float)input_state.mouse_wheel_move;
          fVar13 = (camera->target).x;
          auVar17._0_4_ = fVar14 * (fVar13 - (camera->position).x) * 1.5;
          auVar17._4_4_ = fVar14 * (fVar10 - fVar12) * 1.5;
          auVar17._8_8_ = 0;
          auVar4._4_4_ = fVar11;
          auVar4._0_4_ = fVar11;
          auVar4._8_8_ = 0;
          auVar16 = divps(auVar17,auVar4);
          (camera->target).x = auVar16._0_4_ + fVar13;
          (camera->target).y = auVar16._4_4_ + fVar10;
          fVar12 = (camera->target).z;
          (camera->target).z = ((fVar12 - (camera->position).z) * fVar14 * 1.5) / fVar11 + fVar12;
        }
      }
      else {
        fVar13 = (float)input_state.mouse_wheel_move;
        fVar11 = (camera->target).x;
        auVar15._0_4_ = fVar13 * (fVar11 - (camera->position).x) * 1.5;
        auVar15._4_4_ = fVar13 * (fVar10 - fVar12) * 1.5;
        auVar15._8_8_ = 0;
        auVar16 = divps(auVar15,_DAT_0016fcc0);
        (camera->target).x = auVar16._0_4_ + fVar11;
        (camera->target).y = auVar16._4_4_ + fVar10;
        fVar11 = (camera->target).z;
        (camera->target).z = ((fVar11 - (camera->position).z) * fVar13 * 1.5) / 120.0 + fVar11;
        fVar11 = 120.0;
      }
    }
    else {
      fVar11 = fVar11 + (float)input_state.mouse_wheel_move * -1.5;
      state->camera_target_distance = fVar11;
      if (120.0 < fVar11) {
        state->camera_target_distance = 120.0;
        fVar11 = 120.0;
      }
    }
    if (input_state.is_camera_pan_control_key_down != false) {
      if (input_state.is_camera_alt_control_key_down == false) {
        uStack_40 = 0;
        fVar19 = cosf((state->camera_angle).x);
        fVar11 = local_48._4_4_ * 0.01;
        fVar12 = sinf((state->camera_angle).x);
        fVar10 = sinf((state->camera_angle).y);
        (camera->target).x =
             (state->camera_target_distance / 5.1) *
             (fVar19 * fVar18 * -0.01 + fVar10 * fVar12 * fVar11) + (camera->target).x;
        fVar18 = cosf((state->camera_angle).y);
        (camera->target).y =
             (state->camera_target_distance / 5.1) * fVar18 * fVar11 + (camera->target).y;
        local_48 = CONCAT44(local_48._4_4_,(float)local_48 * 0.01);
        fVar18 = sinf((state->camera_angle).x);
        fVar19 = cosf((state->camera_angle).x);
        fVar12 = sinf((state->camera_angle).y);
        (camera->target).z =
             (state->camera_target_distance / 5.1) *
             (fVar18 * (float)local_48 + fVar12 * fVar19 * fVar11) + (camera->target).z;
      }
      else if (input_state.is_camera_smooth_zoom_control_key == false) {
        fVar19 = fVar19 * -0.01 + (state->camera_angle).y;
        rVar5.y = fVar19;
        rVar5.x = fVar18 * -0.01 + (state->camera_angle).x;
        state->camera_angle = rVar5;
        if (fVar19 <= 1.4835298) {
          if (fVar19 < -1.4835298) {
            (state->camera_angle).y = -1.4835298;
          }
        }
        else {
          (state->camera_angle).y = 1.4835298;
        }
      }
      else {
        state->camera_target_distance = fVar19 * 0.05 + fVar11;
      }
    }
    fVar19 = sinf((state->camera_angle).x);
    fVar18 = state->camera_target_distance;
    fVar11 = cosf((state->camera_angle).y);
    fVar11 = fVar11 * fVar19 * fVar18;
    break;
  case RF_CAMERA_ORBITAL:
    fVar19 = (state->camera_angle).x + 0.01;
    (state->camera_angle).x = fVar19;
    fVar11 = (float)input_state.mouse_wheel_move * -1.5 + state->camera_target_distance;
    fVar18 = 1.2;
    if (1.2 <= fVar11) {
      fVar18 = fVar11;
    }
    state->camera_target_distance = fVar18;
    fVar19 = sinf(fVar19);
    fVar18 = state->camera_target_distance;
    fVar11 = cosf((state->camera_angle).y);
    fVar11 = fVar11 * fVar19 * fVar18;
    break;
  case RF_CAMERA_FIRST_PERSON:
    uStack_40 = 0;
    fVar18 = sinf((state->camera_angle).x);
    fVar19 = (float)input_state.direction_keys[1];
    fVar11 = sinf((state->camera_angle).x);
    fVar13 = (float)input_state.direction_keys[0];
    fVar12 = cosf((state->camera_angle).x);
    local_4c = (float)input_state.direction_keys[3];
    fVar12 = fVar12 * local_4c;
    fVar10 = cosf((state->camera_angle).x);
    local_50 = (float)input_state.direction_keys[2];
    (camera->position).x =
         (fVar10 * local_50 + ((fVar18 * fVar19 - fVar11 * fVar13) - fVar12)) / 20.0 +
         (camera->position).x;
    fVar18 = sinf((state->camera_angle).y);
    fVar11 = sinf((state->camera_angle).y);
    (camera->position).y =
         (((float)input_state.direction_keys[4] + (fVar18 * fVar13 - fVar11 * fVar19)) -
         (float)input_state.direction_keys[5]) / 20.0 + (camera->position).y;
    fVar18 = cosf((state->camera_angle).x);
    fVar11 = cosf((state->camera_angle).x);
    fVar12 = sinf((state->camera_angle).x);
    fVar12 = fVar12 * local_4c;
    fVar10 = sinf((state->camera_angle).x);
    (camera->position).z =
         ((fVar12 + (fVar18 * fVar19 - fVar11 * fVar13)) - fVar10 * local_50) / 20.0 +
         (camera->position).z;
    uVar6 = 0;
    do {
      uVar8 = uVar6;
      if (uVar8 == 6) break;
      uVar6 = uVar8 + 1;
    } while (local_56[uVar8] != '\x01');
    fVar18 = (float)local_48 * -0.003 + (state->camera_angle).x;
    fVar19 = local_48._4_4_ * -0.003 + (state->camera_angle).y;
    rVar3.y = fVar19;
    rVar3.x = fVar18;
    state->camera_angle = rVar3;
    fVar11 = 1.4835298;
    if ((1.4835298 < fVar19) || (fVar11 = -1.4835298, fVar19 < -1.4835298)) {
      (state->camera_angle).y = fVar11;
    }
    fVar19 = (camera->position).x;
    fVar18 = sinf(fVar18);
    (camera->target).x = fVar19 - fVar18 * 25.0;
    fVar18 = (camera->position).y;
    fVar19 = sinf((state->camera_angle).y);
    (camera->target).y = fVar19 * 25.0 + fVar18;
    fVar18 = (camera->position).z;
    fVar19 = cosf((state->camera_angle).x);
    (camera->target).z = fVar18 - fVar19 * 25.0;
    iVar7 = state->swing_counter;
    if (uVar8 < 6) {
      iVar7 = iVar7 + 1;
      state->swing_counter = iVar7;
    }
    fVar18 = state->player_eyes_position;
    fVar19 = sinf((float)iVar7 / 5.0);
    (camera->position).y = fVar19 / -30.0 + fVar18;
    fVar18 = sinf((float)state->swing_counter / 10.0);
    (camera->up).x = fVar18 / 200.0;
    fVar18 = sinf((float)state->swing_counter / 10.0);
    (camera->up).z = fVar18 / -200.0;
    return;
  case RF_CAMERA_THIRD_PERSON:
    local_4c = (float)input_state.mouse_wheel_move;
    local_48 = CONCAT44(fVar19,fVar18);
    uStack_40 = 0;
    sinf((state->camera_angle).x);
    sinf((state->camera_angle).x);
    cosf((state->camera_angle).x);
    local_34 = (float)input_state.direction_keys[3];
    cosf((state->camera_angle).x);
    local_50 = (float)input_state.direction_keys[2];
    fVar18 = sinf((state->camera_angle).y);
    fVar19 = sinf((state->camera_angle).y);
    (camera->position).y =
         (((float)input_state.direction_keys[4] +
          (fVar18 * (float)input_state.direction_keys[0] -
          fVar19 * (float)input_state.direction_keys[1])) - (float)input_state.direction_keys[5]) /
         20.0 + (camera->position).y;
    fVar18 = cosf((state->camera_angle).x);
    fVar19 = cosf((state->camera_angle).x);
    fVar11 = sinf((state->camera_angle).x);
    fVar11 = fVar11 * local_34;
    fVar12 = sinf((state->camera_angle).x);
    (camera->position).z =
         ((fVar11 + (fVar18 * (float)input_state.direction_keys[1] -
                    fVar19 * (float)input_state.direction_keys[0])) - fVar12 * local_50) / 20.0 +
         (camera->position).z;
    fVar19 = (float)local_48 * -0.003 + (state->camera_angle).x;
    fVar11 = local_48._4_4_ * -0.003 + (state->camera_angle).y;
    rVar1.y = fVar11;
    rVar1.x = fVar19;
    state->camera_angle = rVar1;
    fVar18 = 0.08726646;
    if ((0.08726646 < fVar11) || (fVar18 = -1.4835298, fVar11 < -1.4835298)) {
      (state->camera_angle).y = fVar18;
    }
    fVar11 = (float)(int)local_4c * -1.5 + state->camera_target_distance;
    fVar18 = 1.2;
    if (1.2 <= fVar11) {
      fVar18 = fVar11;
    }
    state->camera_target_distance = fVar18;
    fVar19 = sinf(fVar19);
    fVar18 = state->camera_target_distance;
    fVar11 = cosf((state->camera_angle).y);
    (camera->position).x = fVar11 * fVar19 * fVar18 + (camera->target).x;
    fVar18 = (state->camera_angle).y;
    fVar19 = sinf(fVar18);
    if (0.0 < fVar18) {
      fVar19 = -fVar19;
    }
    fVar18 = state->camera_target_distance;
    fVar11 = sinf((state->camera_angle).y);
    fVar11 = fVar11 * fVar19 * fVar18;
    goto LAB_00124947;
  }
  (camera->position).x = fVar11 + (camera->target).x;
  fVar18 = (state->camera_angle).y;
  fVar19 = sinf(fVar18);
  uVar9 = -(uint)(fVar18 <= 0.0);
  fVar18 = state->camera_target_distance;
  fVar11 = sinf((state->camera_angle).y);
  fVar11 = fVar11 * (float)(~uVar9 & (uint)-fVar19 | (uint)fVar19 & uVar9) * fVar18;
LAB_00124947:
  (camera->position).y = fVar11 + (camera->target).y;
  fVar19 = cosf((state->camera_angle).x);
  fVar18 = state->camera_target_distance;
  fVar11 = cosf((state->camera_angle).y);
  (camera->position).z = fVar11 * fVar19 * fVar18 + (camera->target).z;
  return;
}

Assistant:

RF_API void rf_update_camera3d(rf_camera3d* camera, rf_camera3d_state* state, rf_input_state_for_update_camera input_state)
{
    // rf_camera3d mouse movement sensitivity
    #define RF_CAMERA_MOUSE_MOVE_SENSITIVITY 0.003f
    #define RF_CAMERA_MOUSE_SCROLL_SENSITIVITY 1.5f

    // FREE_CAMERA
    #define RF_CAMERA_FREE_MOUSE_SENSITIVITY 0.01f
    #define RF_CAMERA_FREE_DISTANCE_MIN_CLAMP 0.3f
    #define RF_CAMERA_FREE_DISTANCE_MAX_CLAMP 120.0f
    #define RF_CAMERA_FREE_MIN_CLAMP 85.0f
    #define RF_CAMERA_FREE_MAX_CLAMP -85.0f
    #define RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY 0.05f
    #define RF_CAMERA_FREE_PANNING_DIVIDER 5.1f

    // ORBITAL_CAMERA
    #define RF_CAMERA_ORBITAL_SPEED 0.01f // Radians per frame

    // FIRST_PERSON
    //#define CAMERA_FIRST_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE 25.0f
    #define RF_CAMERA_FIRST_PERSON_MIN_CLAMP 85.0f
    #define RF_CAMERA_FIRST_PERSON_MAX_CLAMP -85.0f

    #define RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER 5.0f
    #define RF_CAMERA_FIRST_PERSON_STEP_DIVIDER 30.0f
    #define RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER 200.0f

    // THIRD_PERSON
    //#define CAMERA_THIRD_PERSON_MOUSE_SENSITIVITY           0.003f
    #define RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP 1.2f
    #define RF_CAMERA_THIRD_PERSON_MIN_CLAMP 5.0f
    #define RF_CAMERA_THIRD_PERSON_MAX_CLAMP -85.0f
    #define RF_CAMERA_THIRD_PERSON_OFFSET (rf_vec3) { 0.4f, 0.0f, 0.0f }

    // PLAYER (used by camera)
    #define RF_PLAYER_MOVEMENT_SENSITIVITY 20.0f

    // rf_camera3d move modes (first person and third person cameras)
    typedef enum rf_camera_move
    {
        rf_move_front = 0,
        rf_move_back,
        rf_move_right,
        rf_move_left,
        rf_move_up,
        rf_move_down
    } rf_camera_move;

    // RF_INTERNAL float player_eyes_position = 1.85f;

    // TODO: CRF_INTERNAL rf_ctx->gl_ctx.camera_target_distance and rf_ctx->gl_ctx.camera_angle here

    // Mouse movement detection
    rf_vec2 mouse_position_delta = { 0.0f, 0.0f };
    rf_vec2 mouse_position = input_state.mouse_position;
    int mouse_wheel_move = input_state.mouse_wheel_move;

    // Keys input detection
    bool pan_key = input_state.is_camera_pan_control_key_down;
    bool alt_key = input_state.is_camera_alt_control_key_down;
    bool szoom_key = input_state.is_camera_smooth_zoom_control_key;

    bool direction[6];
    direction[0] = input_state.direction_keys[0];
    direction[1] = input_state.direction_keys[1];
    direction[2] = input_state.direction_keys[2];
    direction[3] = input_state.direction_keys[3];
    direction[4] = input_state.direction_keys[4];
    direction[5] = input_state.direction_keys[5];

    // TODO: Consider touch inputs for camera

    if (state->camera_mode != RF_CAMERA_CUSTOM)
    {
        mouse_position_delta.x = mouse_position.x - state->previous_mouse_position.x;
        mouse_position_delta.y = mouse_position.y - state->previous_mouse_position.y;

        state->previous_mouse_position = mouse_position;
    }

    // Support for multiple automatic camera modes
    switch (state->camera_mode)
    {
        case RF_CAMERA_FREE:
        {
            // Camera zoom
            if ((state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

                if (state->camera_target_distance > RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MAX_CLAMP;
                }
            }
            // Camera looking down
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y > camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y >= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y < 0) camera->target.y = -0.001;
            }
            else if ((camera->position.y > camera->target.y) && (camera->target.y < 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }
            // Camera looking up
            // TODO: Review, weird comparisson of rf_ctx->gl_ctx.camera_target_distance == 120.0f?
            else if ((camera->position.y < camera->target.y) && (state->camera_target_distance == RF_CAMERA_FREE_DISTANCE_MAX_CLAMP) && (mouse_wheel_move < 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y <= 0))
            {
                camera->target.x += mouse_wheel_move * (camera->target.x - camera->position.x) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.y += mouse_wheel_move * (camera->target.y - camera->position.y) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;
                camera->target.z += mouse_wheel_move * (camera->target.z - camera->position.z) * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY / state->camera_target_distance;

                // if (camera->target.y > 0) camera->target.y = 0.001;
            }
            else if ((camera->position.y < camera->target.y) && (camera->target.y > 0) && (mouse_wheel_move > 0))
            {
                state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);
                if (state->camera_target_distance < RF_CAMERA_FREE_DISTANCE_MIN_CLAMP) {
                    state->camera_target_distance = RF_CAMERA_FREE_DISTANCE_MIN_CLAMP;
                }
            }

            // Input keys checks
            if (pan_key)
            {
                if (alt_key) // Alternative key behaviour
                {
                    if (szoom_key)
                    {
                        // Camera smooth zoom
                        state->camera_target_distance += (mouse_position_delta.y * RF_CAMERA_FREE_SMOOTH_ZOOM_SENSITIVITY);
                    }
                    else
                    {
                        // Camera rotation
                        state->camera_angle.x += mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;
                        state->camera_angle.y += mouse_position_delta.y*-RF_CAMERA_FREE_MOUSE_SENSITIVITY;

                        // Angle clamp
                        if (state->camera_angle.y > RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MIN_CLAMP * RF_DEG2RAD;
                        }
                        else if (state->camera_angle.y < RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD) {
                            state->camera_angle.y = RF_CAMERA_FREE_MAX_CLAMP * RF_DEG2RAD;
                        }
                    }
                }
                else
                {
                    // Camera panning
                    camera->target.x += ((mouse_position_delta.x*-RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.y += ((mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                    camera->target.z += ((mouse_position_delta.x * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * sinf(state->camera_angle.x) + (mouse_position_delta.y * RF_CAMERA_FREE_MOUSE_SENSITIVITY) * cosf(state->camera_angle.x) * sinf(state->camera_angle.y)) * (state->camera_target_distance / RF_CAMERA_FREE_PANNING_DIVIDER);
                }
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_ORBITAL:
        {
            state->camera_angle.x += RF_CAMERA_ORBITAL_SPEED; // Camera orbit angle
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY); // Camera zoom

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP) {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // Update camera position with changes
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;
            camera->position.y = ((state->camera_angle.y <= 0.0f)? 1 : -1)*sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        case RF_CAMERA_FIRST_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            bool is_moving = false; // Required for swinging

            for (rf_int i = 0; i < 6; i++) if (direction[i]) { is_moving = true; break; }

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD) {
                state->camera_angle.y = RF_CAMERA_FIRST_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera is always looking at player
            camera->target.x = camera->position.x - sinf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.y = camera->position.y + sinf(state->camera_angle.y) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;
            camera->target.z = camera->position.z - cosf(state->camera_angle.x) * RF_CAMERA_FIRST_PERSON_FOCUS_DISTANCE;

            if (is_moving) {
                state->swing_counter++;
            }

            // Camera position update
            // NOTE: On RF_CAMERA_FIRST_PERSON player Y-movement is limited to player 'eyes position'
            camera->position.y = state->player_eyes_position - sinf(state->swing_counter / RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER) / RF_CAMERA_FIRST_PERSON_STEP_DIVIDER;

            camera->up.x = sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;
            camera->up.z = -sinf(state->swing_counter/(RF_CAMERA_FIRST_PERSON_STEP_TRIGONOMETRIC_DIVIDER * 2)) / RF_CAMERA_FIRST_PERSON_WAVING_DIVIDER;

        } break;

        case RF_CAMERA_THIRD_PERSON:
        {
            camera->position.x += (sinf(state->camera_angle.x)*direction[rf_move_back] -
                                   sinf(state->camera_angle.x)*direction[rf_move_front] -
                                   cosf(state->camera_angle.x)*direction[rf_move_left] +
                                   cosf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.y += (sinf(state->camera_angle.y)*direction[rf_move_front] -
                                   sinf(state->camera_angle.y)*direction[rf_move_back] +
                                   1.0f*direction[rf_move_up] - 1.0f*direction[rf_move_down]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            camera->position.z += (cosf(state->camera_angle.x)*direction[rf_move_back] -
                                   cosf(state->camera_angle.x)*direction[rf_move_front] +
                                   sinf(state->camera_angle.x)*direction[rf_move_left] -
                                   sinf(state->camera_angle.x)*direction[rf_move_right]) / RF_PLAYER_MOVEMENT_SENSITIVITY;

            // Camera orientation calculation
            state->camera_angle.x += (mouse_position_delta.x*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);
            state->camera_angle.y += (mouse_position_delta.y*-RF_CAMERA_MOUSE_MOVE_SENSITIVITY);

            // Angle clamp
            if (state->camera_angle.y > RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MIN_CLAMP * RF_DEG2RAD;
            }
            else if (state->camera_angle.y < RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD)
            {
                state->camera_angle.y = RF_CAMERA_THIRD_PERSON_MAX_CLAMP * RF_DEG2RAD;
            }

            // Camera zoom
            state->camera_target_distance -= (mouse_wheel_move * RF_CAMERA_MOUSE_SCROLL_SENSITIVITY);

            // Camera distance clamp
            if (state->camera_target_distance < RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP)
            {
                state->camera_target_distance = RF_CAMERA_THIRD_PERSON_DISTANCE_CLAMP;
            }

            // TODO: It seems camera->position is not correctly updated or some rounding issue makes the camera move straight to camera->target...
            camera->position.x = sinf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.x;

            if (state->camera_angle.y <= 0.0f)
            {
                camera->position.y = sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }
            else
            {
                camera->position.y = -sinf(state->camera_angle.y)*state->camera_target_distance*sinf(state->camera_angle.y) + camera->target.y;
            }

            camera->position.z = cosf(state->camera_angle.x)*state->camera_target_distance*cosf(state->camera_angle.y) + camera->target.z;

        } break;

        default: break;
    }
}